

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::ReadBlockFromDisk(BlockManager *this,CBlock *block,CBlockIndex *index)

{
  bool bVar1;
  bool bVar2;
  FlatFilePos FVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  FlatFilePos block_pos;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_48,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
             ,0x429,false);
  FVar3 = CBlockIndex::GetBlockPos(index);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_48);
  block_pos = FVar3;
  bVar1 = ReadBlockFromDisk(this,block,&block_pos);
  if (bVar1) {
    CBlockHeader::GetHash((uint256 *)&local_48,&block->super_CBlockHeader);
    CBlockIndex::GetBlockHash((uint256 *)&local_68,index);
    bVar1 = operator!=((base_blob<256U> *)&local_48,(base_blob<256U> *)&local_68);
    bVar2 = true;
    if (!bVar1) goto LAB_001e0d2c;
    CBlockIndex::ToString_abi_cxx11_(&local_48,index);
    FlatFilePos::ToString_abi_cxx11_(&local_68,&block_pos);
    logging_function._M_str = "ReadBlockFromDisk";
    logging_function._M_len = 0x11;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x42f,ALL,Error,(ConstevalFormatString<3U>)0x68d6f6,
               (char (*) [18])"ReadBlockFromDisk",&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  bVar2 = false;
LAB_001e0d2c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadBlockFromDisk(CBlock& block, const CBlockIndex& index) const
{
    const FlatFilePos block_pos{WITH_LOCK(cs_main, return index.GetBlockPos())};

    if (!ReadBlockFromDisk(block, block_pos)) {
        return false;
    }
    if (block.GetHash() != index.GetBlockHash()) {
        LogError("%s: GetHash() doesn't match index for %s at %s\n", __func__, index.ToString(), block_pos.ToString());
        return false;
    }
    return true;
}